

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O3

int __thiscall
AddForm::verify(AddForm *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  pointer ppVVar1;
  byte *pbVar2;
  Varnode *pVVar3;
  Varnode *pVVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  PcodeOp *pPVar9;
  long lVar10;
  Varnode *pVVar11;
  ulong uVar12;
  ulong uVar13;
  _List_node_base *p_Var14;
  undefined8 unaff_RBP;
  undefined8 uVar15;
  uint uVar16;
  
  this->hi1 = (Varnode *)ctx;
  this->lo1 = (Varnode *)sig;
  uVar8 = (ulong)(*(long *)(siglen + 0x58) - *(long *)(siglen + 0x50)) >> 3;
  uVar16 = 0;
  uVar12 = 0;
  uVar7 = (uint)uVar8;
  if (0 < (int)uVar7) {
    uVar12 = 0;
    do {
      if (*(EVP_PKEY_CTX **)(*(long *)(siglen + 0x50) + uVar12 * 8) == ctx) goto LAB_002dc9b3;
      uVar12 = uVar12 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar12);
    uVar12 = uVar8 & 0xffffffff;
  }
LAB_002dc9b3:
  this->slot1 = (int4)uVar12;
  uVar15 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  do {
    if (uVar16 == 1) {
      pbVar2 = *(byte **)(*(long *)(siglen + 0x50) + (1 - (long)this->slot1) * 8);
      if ((*pbVar2 & 0x10) != 0) {
        pPVar9 = *(PcodeOp **)(pbVar2 + 0x20);
        this->add2 = pPVar9;
        if (pPVar9->opcode->opcode == CPUI_INT_ADD) {
          this->reshi = *(Varnode **)(siglen + 0x48);
          ppVVar1 = (pPVar9->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          this->hizext1 = *ppVVar1;
          pVVar11 = ppVVar1[1];
          goto LAB_002dcafb;
        }
      }
    }
    else {
      if (uVar16 == 0) {
        pPVar9 = Varnode::loneDescend(*(Varnode **)(siglen + 0x48));
        this->add2 = pPVar9;
        if ((pPVar9 == (PcodeOp *)0x0) || (pPVar9->opcode->opcode != CPUI_INT_ADD))
        goto LAB_002dcc88;
        this->reshi = pPVar9->output;
        this->hizext1 = *(Varnode **)(*(long *)(siglen + 0x50) + (1 - (long)this->slot1) * 8);
        ppVVar1 = (pPVar9->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        uVar8 = (ulong)((long)(pPVar9->inrefs).
                              super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3;
        uVar7 = (uint)uVar8;
        if ((int)uVar7 < 1) {
          lVar10 = 8;
        }
        else {
          uVar12 = 0;
          do {
            uVar13 = uVar12;
            if (ppVVar1[uVar12] == *(Varnode **)(siglen + 0x48)) break;
            uVar12 = uVar12 + 1;
            uVar13 = uVar8;
          } while ((uVar7 & 0x7fffffff) != uVar12);
          lVar10 = (long)(0x100000000 - (uVar13 << 0x20)) >> 0x1d;
        }
        pVVar11 = *(Varnode **)((long)ppVVar1 + lVar10);
      }
      else {
        this->reshi = *(Varnode **)(siglen + 0x48);
        this->hizext1 = *(Varnode **)(*(long *)(siglen + 0x50) + (1 - (long)this->slot1) * 8);
        pVVar11 = (Varnode *)0x0;
      }
LAB_002dcafb:
      this->hizext2 = pVVar11;
      bVar6 = true;
      do {
        bVar5 = bVar6;
        if (uVar16 == 2) {
          if ((this->hizext1->flags & 0x10) != 0) {
            pPVar9 = this->hizext1->def;
            this->zextop = pPVar9;
            pVVar11 = (Varnode *)0x0;
            goto LAB_002dcb6d;
          }
        }
        else {
          if (bVar5) {
            if ((this->hizext1->flags & 0x10) == 0) goto LAB_002dcc78;
            pPVar9 = this->hizext1->def;
            this->zextop = pPVar9;
            pVVar11 = this->hizext2;
          }
          else {
            if ((this->hizext2->flags & 0x10) == 0) break;
            pPVar9 = this->hizext2->def;
            this->zextop = pPVar9;
            pVVar11 = this->hizext1;
          }
LAB_002dcb6d:
          this->hi2 = pVVar11;
          bVar6 = checkForCarry(this,pPVar9);
          if (bVar6) {
            pVVar11 = this->lo1;
            p_Var14 = (pVVar11->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                      _M_impl._M_node.super__List_node_base._M_next;
            if (p_Var14 != (_List_node_base *)&pVVar11->descend) {
              pVVar3 = this->lo2;
              do {
                pPVar9 = (PcodeOp *)p_Var14[1]._M_next;
                this->loadd = pPVar9;
                p_Var14 = p_Var14->_M_next;
                if (pPVar9->opcode->opcode == CPUI_INT_ADD) {
                  ppVVar1 = (pPVar9->inrefs).
                            super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar8 = (ulong)((long)(pPVar9->inrefs).
                                        super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1)
                          >> 3;
                  uVar7 = (uint)uVar8;
                  if ((int)uVar7 < 1) {
                    lVar10 = 8;
                  }
                  else {
                    uVar12 = 0;
                    do {
                      uVar13 = uVar12;
                      if (ppVVar1[uVar12] == pVVar11) break;
                      uVar12 = uVar12 + 1;
                      uVar13 = uVar8;
                    } while ((uVar7 & 0x7fffffff) != uVar12);
                    lVar10 = (long)(0x100000000 - (uVar13 << 0x20)) >> 0x1d;
                  }
                  pVVar4 = *(Varnode **)((long)ppVVar1 + lVar10);
                  if (pVVar3 == (Varnode *)0x0) {
                    if (((pVVar4->flags & 2) != 0) && ((pVVar4->loc).offset == this->negconst)) {
                      this->lo2 = pVVar4;
                      goto LAB_002dccac;
                    }
                  }
                  else if ((pVVar3->flags & 2) == 0) {
                    if ((int)uVar7 < 1) {
                      lVar10 = 8;
                    }
                    else {
                      uVar12 = 0;
                      do {
                        uVar13 = uVar12;
                        if (ppVVar1[uVar12] == pVVar11) break;
                        uVar12 = uVar12 + 1;
                        uVar13 = uVar8;
                      } while ((uVar7 & 0x7fffffff) != uVar12);
                      lVar10 = (long)(0x100000000 - (uVar13 << 0x20)) >> 0x1d;
                    }
                    if (*(Varnode **)((long)ppVVar1 + lVar10) == pVVar3) {
LAB_002dccac:
                      this->reslo = pPVar9->output;
                      return (int)uVar15;
                    }
                  }
                  else if (((pVVar4->flags & 2) != 0) &&
                          ((pVVar3->loc).offset == (pVVar4->loc).offset)) goto LAB_002dccac;
                }
              } while (p_Var14 != (_List_node_base *)&pVVar11->descend);
            }
          }
        }
LAB_002dcc78:
        bVar6 = false;
      } while (bVar5);
    }
LAB_002dcc88:
    bVar6 = uVar16 < 2;
    uVar16 = uVar16 + 1;
    uVar15 = CONCAT71((int7)((ulong)uVar15 >> 8),bVar6);
    if (uVar16 == 3) {
      return 0;
    }
  } while( true );
}

Assistant:

bool AddForm::verify(Varnode *h,Varnode *l,PcodeOp *op)

{
  hi1 = h;
  lo1 = l;
  slot1 = op->getSlot(hi1);
  for(int4 i=0;i<3;++i) {
    if (i==0) {		// Assume we have to descend one more add
      add2 = op->getOut()->loneDescend();
      if (add2 == (PcodeOp *)0) continue;
      if (add2->code() != CPUI_INT_ADD) continue;
      reshi = add2->getOut();
      hizext1 = op->getIn(1-slot1);
      hizext2 = add2->getIn(1-add2->getSlot(op->getOut()));
    }
    else if (i==1) {		// Assume we are at the bottom most of two adds
      Varnode *tmpvn = op->getIn(1-slot1);
      if (!tmpvn->isWritten()) continue;
      add2 = tmpvn->getDef();
      if (add2->code() != CPUI_INT_ADD) continue;
      reshi = op->getOut();
      hizext1 = add2->getIn(0);
      hizext2 = add2->getIn(1);
    }
    else {			// Assume there is only one add, with second implied add by 0
      reshi = op->getOut();
      hizext1 = op->getIn(1-slot1);
      hizext2 = (Varnode *)0;
    }
    for(int4 j=0;j<2;++j) {
      if (i==2) {		// hi2 is an implied 0
	if (!hizext1->isWritten()) continue;
	zextop = hizext1->getDef();
	hi2 = (Varnode *)0;
      }
      else if (j==0) {
	if (!hizext1->isWritten()) continue;
	zextop = hizext1->getDef();
	hi2 = hizext2;
      }
      else {
	if (!hizext2->isWritten()) continue;
	zextop = hizext2->getDef();
	hi2 = hizext1;
      }
      if (!checkForCarry(zextop)) continue; // Calculate lo2 and negconst

      list<PcodeOp *>::const_iterator iter2,enditer2;
      iter2 = lo1->beginDescend();
      enditer2 = lo1->endDescend();
      while(iter2 != enditer2) {
	loadd = *iter2;
	++iter2;
	if (loadd->code() != CPUI_INT_ADD) continue;
	Varnode *tmpvn = loadd->getIn(1-loadd->getSlot(lo1));
	if (lo2 == (Varnode *)0) {
	  if (!tmpvn->isConstant()) continue;
	  if (tmpvn->getOffset() != negconst) continue;	// Must add same constant used to calculate CARRY
	  lo2 = tmpvn;
	}
	else if (lo2->isConstant()) {
	  if (!tmpvn->isConstant()) continue;
	  if (lo2->getOffset() != tmpvn->getOffset()) continue;
	}
	else if (loadd->getIn(1-loadd->getSlot(lo1)) != lo2) // Must add same value used to calculate CARRY
	  continue;
	reslo = loadd->getOut();
	return true;
      }
    }
  }
  return false;
}